

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_NtkDivisors_rec(Acb_Ntk_t *p,int iObj,int nTfiLevMin,Vec_Int_t *vDivs)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((nTfiLevMin < 0) && ((p->vObjType).pArray[(uint)iObj] != '\x03')) {
    return;
  }
  if (iObj < (p->vObjTrav).nSize) {
    piVar3 = (p->vObjTrav).pArray;
    iVar1 = p->nObjTravs;
    iVar2 = piVar3[(uint)iObj];
    piVar3[(uint)iObj] = iVar1;
    if (iVar2 == iVar1) {
      return;
    }
    if (iObj < (p->vObjFans).nSize) {
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      lVar6 = (long)iVar1;
      if ((-1 < lVar6) && (iVar1 < (p->vFanSto).nSize)) {
        piVar3 = (p->vFanSto).pArray;
        if (0 < piVar3[lVar6]) {
          lVar5 = 0;
          do {
            lVar4 = lVar5 + 1;
            lVar5 = lVar5 + 1;
            Acb_NtkDivisors_rec(p,piVar3[lVar6 + lVar4],nTfiLevMin + -1,vDivs);
          } while (lVar5 < piVar3[lVar6]);
        }
        Vec_IntPush(vDivs,iObj);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkDivisors_rec( Acb_Ntk_t * p, int iObj, int nTfiLevMin, Vec_Int_t * vDivs )
{
    int k, iFanin, * pFanins;
//    if ( !Acb_ObjIsCi(p, iObj) && Acb_ObjLevelD(p, iObj) < nTfiLevMin )
    if ( !Acb_ObjIsCi(p, iObj) && nTfiLevMin < 0 )
        return;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Acb_NtkDivisors_rec( p, iFanin, nTfiLevMin-1, vDivs );
    Vec_IntPush( vDivs, iObj );
}